

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void art_replace(art_inner_node_t *node,art_typecode_t typecode,art_key_chunk_t key_chunk,
                art_ref_t new_child)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  undefined7 in_register_00000031;
  ulong uVar3;
  
  switch((int)CONCAT71(in_register_00000031,typecode)) {
  case 2:
    puVar2 = node[2].prefix + 3;
    uVar3 = 0;
    while( true ) {
      if (node[1].prefix_size == uVar3) {
        return;
      }
      if (node[1].prefix[uVar3] == key_chunk) break;
      uVar3 = uVar3 + 1;
      puVar2 = puVar2 + 8;
    }
    break;
  case 3:
    puVar2 = node[2].prefix + 3;
    uVar3 = 0;
    do {
      if (node[1].prefix_size == uVar3) {
        return;
      }
      puVar2 = puVar2 + 8;
      puVar1 = node[1].prefix + uVar3;
      uVar3 = uVar3 + 1;
    } while (*puVar1 != key_chunk);
    break;
  case 4:
    puVar2 = (uint8_t *)((long)node + (ulong)node[2].prefix[(ulong)key_chunk + 3] * 8 + 0x110);
    break;
  case 5:
    puVar2 = (uint8_t *)((long)node + (ulong)key_chunk * 8 + 8);
    break;
  default:
    goto switchD_00106021_default;
  }
  *(art_ref_t *)puVar2 = new_child;
switchD_00106021_default:
  return;
}

Assistant:

static void art_replace(art_inner_node_t *node, art_typecode_t typecode,
                        art_key_chunk_t key_chunk, art_ref_t new_child) {
    switch (typecode) {
        case CROARING_ART_NODE4_TYPE:
            art_node4_replace((art_node4_t *)node, key_chunk, new_child);
            break;
        case CROARING_ART_NODE16_TYPE:
            art_node16_replace((art_node16_t *)node, key_chunk, new_child);
            break;
        case CROARING_ART_NODE48_TYPE:
            art_node48_replace((art_node48_t *)node, key_chunk, new_child);
            break;
        case CROARING_ART_NODE256_TYPE:
            art_node256_replace((art_node256_t *)node, key_chunk, new_child);
            break;
        default:
            assert(false);
    }
}